

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  ostream *poVar4;
  int local_50;
  int out0_1;
  int compNdx_1;
  uint local_44;
  uint local_40;
  deUint32 ref;
  deUint32 out0;
  float in0;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  IsnanCase *this_local;
  
  _precision = outputs;
  outputs_local = inputs;
  inputs_local = (void **)this;
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  scalarSize = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](&(this->super_CommonFunctionCase).m_spec.inputs,0);
  compNdx = glu::VarType::getPrecision(&pvVar3->varType);
  in0 = (float)glu::getDataTypeScalarSize(scalarSize);
  if (compNdx == 2) {
    for (out0 = 0; (int)out0 < (int)in0; out0 = out0 + 1) {
      ref = *(deUint32 *)((long)*outputs_local + (long)(int)out0 * 4);
      local_40 = *(uint *)((long)*_precision + (long)(int)out0 * 4);
      tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
                ((Float<unsigned_int,_8,_23,_127,_3U> *)&compNdx_1,(float)ref);
      bVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::isNaN
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)&compNdx_1);
      local_44 = (uint)bVar2;
      if (local_40 != local_44) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,out0);
        poVar4 = std::operator<<(poVar4,"] = ");
        HexBool::HexBool((HexBool *)&out0_1,local_44);
        Functional::operator<<(poVar4,(HexBool *)&out0_1);
        return false;
      }
    }
  }
  else {
    for (local_50 = 0; local_50 < (int)in0; local_50 = local_50 + 1) {
      iVar1 = *(int *)((long)*_precision + (long)local_50 * 4);
      if ((iVar1 != 0) && (iVar1 != 1)) {
        poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionCase).m_failMsg,"Expected ["
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_50);
        std::operator<<(poVar4,"] = 0 / 1");
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
				const deUint32	ref		= tcu::Float32(in0).isNaN() ? 1u : 0u;

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else
		{
			// Value can be either 0 or 1
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int out0 = ((const int*)outputs[0])[compNdx];

				if (out0 != 0 && out0 != 1)
				{
					m_failMsg << "Expected [" << compNdx << "] = 0 / 1";
					return false;
				}
			}
		}

		return true;
	}